

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrature.hpp
# Opt level: O0

void __thiscall
IntegratorXX::Quadrature<IntegratorXX::GaussLobatto<double,double>>::Quadrature<unsigned_long&,void>
          (Quadrature<IntegratorXX::GaussLobatto<double,double>> *this,unsigned_long *args)

{
  unsigned_long *in_RDX;
  tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  local_48;
  unsigned_long *local_18;
  unsigned_long *args_local;
  Quadrature<IntegratorXX::GaussLobatto<double,_double>_> *this_local;
  
  local_18 = args;
  args_local = (unsigned_long *)this;
  generate<unsigned_long&>
            (&local_48,(Quadrature<IntegratorXX::GaussLobatto<double,double>> *)args,in_RDX);
  Quadrature<IntegratorXX::GaussLobatto<double,_double>_>::Quadrature
            ((Quadrature<IntegratorXX::GaussLobatto<double,_double>_> *)this,&local_48);
  std::
  tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  ::~tuple(&local_48);
  return;
}

Assistant:

Quadrature( Args&&... args ) :
    Quadrature( generate( std::forward<Args>(args)... ) ) { }